

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

int sat_solver2_check_watched(sat_solver2 *s)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  veci *pvVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int claSat [2];
  int local_38 [2];
  
  local_38[0] = 0;
  local_38[1] = 0;
  if (0 < s->size) {
    pvVar4 = s->wlists;
    lVar9 = 0;
    do {
      iVar10 = pvVar4[lVar9].size;
      if (iVar10 < 1) {
        iVar11 = 0;
      }
      else {
        piVar5 = pvVar4[lVar9].ptr;
        lVar12 = 0;
        iVar11 = 0;
        do {
          uVar1 = piVar5[lVar12];
          uVar8 = (s->Mem).uPageMask & uVar1;
          if (uVar8 == 0) {
            __assert_fail("k",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                          ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
          }
          piVar6 = (s->Mem).pPages[(int)uVar1 >> ((byte)(s->Mem).nPageSize & 0x1f)];
          uVar2 = piVar6[(int)uVar8];
          uVar13 = 0;
          if (uVar2 < 0x800) {
LAB_008e7bd0:
            if ((uint)uVar13 == uVar2 >> 0xb) goto LAB_008e7c14;
            local_38[uVar2 & 1] = local_38[uVar2 & 1] + 1;
          }
          else {
            uVar13 = 0;
            do {
              uVar3 = piVar6[(long)(int)uVar8 + uVar13 + 1];
              if ((uVar3 & 1) == (int)s->assigns[(int)uVar3 >> 1]) goto LAB_008e7bd0;
              uVar13 = uVar13 + 1;
            } while (uVar2 >> 0xb != uVar13);
LAB_008e7c14:
            lVar7 = (long)iVar11;
            iVar11 = iVar11 + 1;
            piVar5[lVar7] = uVar1;
            iVar10 = pvVar4[lVar9].size;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar10);
      }
      if (iVar10 < iVar11) {
        __assert_fail("k <= v->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                      ,0x30,"void veci_resize(veci *, int)");
      }
      pvVar4[lVar9].size = iVar11;
      lVar9 = lVar9 + 1;
    } while (SBORROW8(lVar9,(long)s->size * 2) != lVar9 + (long)s->size * -2 < 0);
  }
  return 0;
}

Assistant:

int sat_solver2_check_watched( sat_solver2* s )
{
    clause * c;
    int i, k, j, m;
    int claSat[2] = {0};
    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        int * pArray = veci_begin(&s->wlists[i]);
        for ( m = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            c = clause2_read(s, pArray[k]);
            for ( j = 0; j < (int)c->size; j++ )
                if ( var_value(s, lit_var(c->lits[j])) == lit_sign(c->lits[j]) ) // true lit
                    break;
            if ( j == (int)c->size )
            {
                pArray[m++] = pArray[k];
                continue;
            }
            claSat[c->lrn]++;
        }
        veci_resize(&s->wlists[i],m);
        if ( m == 0 )
        {
//            s->wlists[i].cap = 0;
//            s->wlists[i].size = 0;
//            ABC_FREE( s->wlists[i].ptr );
        }
    }
//    printf( "\nClauses = %d  (Sat = %d).  Learned = %d  (Sat = %d).\n",
//        s->stats.clauses, claSat[0], s->stats.learnts, claSat[1] );
    return 0;
}